

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O2

GMM_STATUS __thiscall
GmmLib::GmmGen12TextureCalc::GetCCSScaleFactor
          (GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,CCS_UNIT *ScaleFactor)

{
  undefined8 uVar1;
  uint32_t uVar2;
  uint uVar3;
  undefined8 local_918;
  GMM_TEXTURE_ALIGN_EX TexAlignEx;
  
  (*((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
     super_GmmTextureCalc.pGmmLibContext)->pPlatformInfo->_vptr_PlatformInfo[9])(&local_918);
  if ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) == 0) {
    uVar3 = pTexInfo->CCSModeAlign;
  }
  else {
    if ((int)pTexInfo->TileMode < 0xd) {
      return GMM_ERROR;
    }
    uVar3 = pTexInfo->TileMode - TILE_YF_2D_8bpe;
  }
  if (uVar3 < 0x60) {
    uVar1 = *(undefined8 *)&TexAlignEx.CCSEx[uVar3].Align.Depth;
    (ScaleFactor->Downscale).Height = (int)uVar1;
    (ScaleFactor->Downscale).Depth = (int)((ulong)uVar1 >> 0x20);
    uVar2 = TexAlignEx.CCSEx[(ulong)uVar3 - 1].Downscale.Depth;
    uVar1 = *(undefined8 *)&TexAlignEx.CCSEx[uVar3].Align;
    (ScaleFactor->Align).Width = TexAlignEx.CCSEx[(ulong)uVar3 - 1].Downscale.Height;
    (ScaleFactor->Align).Height = uVar2;
    *(undefined8 *)&(ScaleFactor->Align).Depth = uVar1;
  }
  return (uint)(uVar3 >= 0x60);
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen12TextureCalc::GetCCSScaleFactor(GMM_TEXTURE_INFO *pTexInfo,
                                                                      CCS_UNIT &        ScaleFactor)
{
    GMM_STATUS           Status     = GMM_SUCCESS;
    GMM_TEXTURE_ALIGN_EX TexAlignEx = static_cast<PlatformInfoGen12 *>(pGmmLibContext->GetPlatformInfoObj())->GetExTextureAlign();
    uint32_t             CCSModeIdx = 0;

    if(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) //pTexInfo is RT Surf
    {
        CCSModeIdx = CCS_MODE(pTexInfo->TileMode);
        __GMM_ASSERT(pTexInfo->TileMode < GMM_TILE_MODES);
    }
    else //pTexInfo is CCS Surf
    {
        CCSModeIdx = pTexInfo->CCSModeAlign;
    }

    if(!(CCSModeIdx < CCS_MODES))
    {
        __GMM_ASSERT(0); //indicates something wrong w/ H/V/D Align Filling function or Wrong TileMode set
        return GMM_ERROR;
    }

    ScaleFactor = TexAlignEx.CCSEx[CCSModeIdx];

    return (Status);
}